

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerBase.cpp
# Opt level: O0

void Diligent::ValidateSamplerDesc(SamplerDesc *Desc,IRenderDevice *pDevice)

{
  SAMPLER_FLAGS b;
  SAMPLER_FLAGS SVar1;
  bool bVar2;
  SHADING_RATE_CAP_FLAGS SVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar6;
  char (*in_stack_ffffffffffffff98) [57];
  code *pcVar7;
  uint local_50;
  Uint32 local_4c;
  undefined1 local_48 [8];
  string _msg;
  GraphicsAdapterInfo *AdapterInfo;
  RenderDeviceInfo *DeviceInfo;
  IRenderDevice *pDevice_local;
  SamplerDesc *Desc_local;
  
  iVar4 = (*(pDevice->super_IObject)._vptr_IObject[0x18])();
  iVar5 = (*(pDevice->super_IObject)._vptr_IObject[0x19])();
  _msg.field_2._8_8_ = CONCAT44(extraout_var_00,iVar5);
  SVar1 = Desc->Flags;
  b = operator|(SAMPLER_FLAG_SUBSAMPLED,SAMPLER_FLAG_LAST);
  SVar1 = operator&(SVar1,b);
  if ((SVar1 != SAMPLER_FLAG_NONE) &&
     (SVar3 = operator&(*(SHADING_RATE_CAP_FLAGS *)(_msg.field_2._8_8_ + 0x154),
                        SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET),
     SVar3 == SHADING_RATE_CAP_FLAG_NONE)) {
    LogError<true,char[25],char_const*,char[15],char[87]>
              (false,"ValidateSamplerDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
               ,0x31,(char (*) [25])"Description of sampler \'",(char **)Desc,
               (char (*) [15])"\' is invalid: ",
               (char (*) [87])
               "Subsampled sampler requires SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET capability."
              );
  }
  if ((Desc->UnnormalizedCoords & 1U) != 0) {
    bVar2 = RenderDeviceInfo::IsVulkanDevice((RenderDeviceInfo *)CONCAT44(extraout_var,iVar4));
    if ((!bVar2) &&
       (bVar2 = RenderDeviceInfo::IsMetalDevice((RenderDeviceInfo *)CONCAT44(extraout_var,iVar4)),
       !bVar2)) {
      LogError<true,char[25],char_const*,char[15],char[65]>
                (false,"ValidateSamplerDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
                 ,0x36,(char (*) [25])"Description of sampler \'",(char **)Desc,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [65])"Unnormalized coordinates are only supported in Vulkan and Metal.");
    }
    if (Desc->MinFilter != Desc->MagFilter) {
      LogError<true,char[25],char_const*,char[15],char[72]>
                (false,"ValidateSamplerDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
                 ,0x38,(char (*) [25])"Description of sampler \'",(char **)Desc,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [72])
                 "When UnnormalizedCoords is true, MinFilter and MagFilter must be equal.");
    }
    if (Desc->MipFilter != FILTER_TYPE_POINT) {
      LogError<true,char[25],char_const*,char[15],char[70]>
                (false,"ValidateSamplerDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
                 ,0x39,(char (*) [25])"Description of sampler \'",(char **)Desc,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [70])
                 "When UnnormalizedCoords is true, MipFilter must be FILTER_TYPE_POINT.");
    }
    if ((Desc->AddressU != TEXTURE_ADDRESS_CLAMP) && (Desc->AddressU != TEXTURE_ADDRESS_BORDER)) {
      LogError<true,char[25],char_const*,char[15],char[67]>
                (false,"ValidateSamplerDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
                 ,0x3a,(char (*) [25])"Description of sampler \'",(char **)Desc,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [67])"When UnnormalizedCoords is true, AddressU must be CLAMP or BORDER."
                );
    }
    if ((Desc->AddressV != TEXTURE_ADDRESS_CLAMP) && (Desc->AddressV != TEXTURE_ADDRESS_BORDER)) {
      LogError<true,char[25],char_const*,char[15],char[67]>
                (false,"ValidateSamplerDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
                 ,0x3b,(char (*) [25])"Description of sampler \'",(char **)Desc,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [67])"When UnnormalizedCoords is true, AddressV must be CLAMP or BORDER."
                );
    }
    bVar2 = IsComparisonFilter(Desc->MinFilter);
    if (bVar2) {
      LogError<true,char[25],char_const*,char[15],char[81]>
                (false,"ValidateSamplerDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
                 ,0x3c,(char (*) [25])"Description of sampler \'",(char **)Desc,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [81])
                 "When UnnormalizedCoords is true, MinFilter and MagFilter must not be comparison.")
      ;
    }
    bVar2 = IsAnisotropicFilter(Desc->MinFilter);
    if (bVar2) {
      LogError<true,char[25],char_const*,char[15],char[82]>
                (false,"ValidateSamplerDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
                 ,0x3d,(char (*) [25])"Description of sampler \'",(char **)Desc,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [82])
                 "When UnnormalizedCoords is true, MinFilter and MagFilter must not be anisotropic."
                );
    }
  }
  bVar2 = IsAnisotropicFilter(Desc->MinFilter);
  if ((bVar2) && ((uint)*(byte *)(_msg.field_2._8_8_ + 0x12d) < Desc->MaxAnisotropy)) {
    local_4c = Desc->MaxAnisotropy;
    local_50 = (uint)*(byte *)(_msg.field_2._8_8_ + 0x12d);
    FormatString<char[16],unsigned_int,char[26],char_const*,char[45],unsigned_int,char[57]>
              ((string *)local_48,(Diligent *)"MaxAnisotropy (",(char (*) [16])&local_4c,
               (uint *)") requested for sampler \'",(char (*) [26])Desc,
               (char **)"\' exceeds the maximum supported anisotropy (",(char (*) [45])&local_50,
               (uint *)"). Check the value of AdapterInfo.Sampler.MaxAnisotropy.",
               in_stack_ffffffffffffff98);
    if (DebugMessageCallback != (undefined *)0x0) {
      pcVar7 = (code *)DebugMessageCallback;
      uVar6 = std::__cxx11::string::c_str();
      (*pcVar7)(1,uVar6,0);
    }
    std::__cxx11::string::~string((string *)local_48);
  }
  if ((*(byte *)(_msg.field_2._8_8_ + 300) & 1) == 0) {
    if (Desc->AddressU == TEXTURE_ADDRESS_BORDER) {
      LogError<true,char[25],char_const*,char[15],char[112]>
                (false,"ValidateSamplerDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
                 ,0x4a,(char (*) [25])"Description of sampler \'",(char **)Desc,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [112])
                 "Border address mode is not supported by this device. Check Sampler.BorderSamplingModeSupported adapter property"
                );
    }
    if (Desc->AddressV == TEXTURE_ADDRESS_BORDER) {
      LogError<true,char[25],char_const*,char[15],char[112]>
                (false,"ValidateSamplerDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
                 ,0x4b,(char (*) [25])"Description of sampler \'",(char **)Desc,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [112])
                 "Border address mode is not supported by this device. Check Sampler.BorderSamplingModeSupported adapter property"
                );
    }
    if (Desc->AddressW == TEXTURE_ADDRESS_BORDER) {
      LogError<true,char[25],char_const*,char[15],char[112]>
                (false,"ValidateSamplerDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/SamplerBase.cpp"
                 ,0x4c,(char (*) [25])"Description of sampler \'",(char **)Desc,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [112])
                 "Border address mode is not supported by this device. Check Sampler.BorderSamplingModeSupported adapter property"
                );
    }
  }
  return;
}

Assistant:

void ValidateSamplerDesc(const SamplerDesc& Desc, const IRenderDevice* pDevice)
{
    const RenderDeviceInfo&    DeviceInfo  = pDevice->GetDeviceInfo();
    const GraphicsAdapterInfo& AdapterInfo = pDevice->GetAdapterInfo();
    if (Desc.Flags & (SAMPLER_FLAG_SUBSAMPLED | SAMPLER_FLAG_SUBSAMPLED_COARSE_RECONSTRUCTION))
    {
        VERIFY_SAMPLER(AdapterInfo.ShadingRate.CapFlags & SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET,
                       "Subsampled sampler requires SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET capability.");
    }
    if (Desc.UnnormalizedCoords)
    {
        VERIFY_SAMPLER(DeviceInfo.IsVulkanDevice() || DeviceInfo.IsMetalDevice(),
                       "Unnormalized coordinates are only supported in Vulkan and Metal.");

        VERIFY_SAMPLER(Desc.MinFilter == Desc.MagFilter, "When UnnormalizedCoords is true, MinFilter and MagFilter must be equal.");
        VERIFY_SAMPLER(Desc.MipFilter == FILTER_TYPE_POINT, "When UnnormalizedCoords is true, MipFilter must be FILTER_TYPE_POINT.");
        VERIFY_SAMPLER(Desc.AddressU == TEXTURE_ADDRESS_CLAMP || Desc.AddressU == TEXTURE_ADDRESS_BORDER, "When UnnormalizedCoords is true, AddressU must be CLAMP or BORDER.");
        VERIFY_SAMPLER(Desc.AddressV == TEXTURE_ADDRESS_CLAMP || Desc.AddressV == TEXTURE_ADDRESS_BORDER, "When UnnormalizedCoords is true, AddressV must be CLAMP or BORDER.");
        VERIFY_SAMPLER(!IsComparisonFilter(Desc.MinFilter), "When UnnormalizedCoords is true, MinFilter and MagFilter must not be comparison.");
        VERIFY_SAMPLER(!IsAnisotropicFilter(Desc.MinFilter), "When UnnormalizedCoords is true, MinFilter and MagFilter must not be anisotropic.");
    }
    if (IsAnisotropicFilter(Desc.MinFilter))
    {
        if (Desc.MaxAnisotropy > AdapterInfo.Sampler.MaxAnisotropy)
        {
            LOG_WARNING_MESSAGE("MaxAnisotropy (", Uint32{Desc.MaxAnisotropy}, ") requested for sampler '", Desc.Name,
                                "' exceeds the maximum supported anisotropy (", Uint32{AdapterInfo.Sampler.MaxAnisotropy},
                                "). Check the value of AdapterInfo.Sampler.MaxAnisotropy.");
        }
    }
    if (!AdapterInfo.Sampler.BorderSamplingModeSupported)
    {
        VERIFY_SAMPLER(Desc.AddressU != TEXTURE_ADDRESS_BORDER, "Border address mode is not supported by this device. Check Sampler.BorderSamplingModeSupported adapter property");
        VERIFY_SAMPLER(Desc.AddressV != TEXTURE_ADDRESS_BORDER, "Border address mode is not supported by this device. Check Sampler.BorderSamplingModeSupported adapter property");
        VERIFY_SAMPLER(Desc.AddressW != TEXTURE_ADDRESS_BORDER, "Border address mode is not supported by this device. Check Sampler.BorderSamplingModeSupported adapter property");
    }
}